

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basist::basisu_transcoder_state::block_preds>::vector
          (vector<basist::basisu_transcoder_state::block_preds> *this,
          vector<basist::basisu_transcoder_state::block_preds> *other)

{
  uint uVar1;
  
  this->m_p = (block_preds *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  increase_capacity(this,other->m_size,false,false);
  uVar1 = other->m_size;
  this->m_size = uVar1;
  if ((this->m_p != (block_preds *)0x0) && (other->m_p != (block_preds *)0x0)) {
    memcpy(this->m_p,other->m_p,(ulong)uVar1 << 2);
    return;
  }
  return;
}

Assistant:

inline vector(const vector& other) :
         m_p(NULL),
         m_size(0),
         m_capacity(0)
      {
         increase_capacity(other.m_size, false);

         m_size = other.m_size;

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }
      }